

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O3

Node ** __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::UArrIntermediateNode::childByTop
          (UArrIntermediateNode *this,Top t,bool canCreate)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  Node **ppNVar4;
  Top TVar5;
  int iStack_4b;
  int iStack_3b;
  
  iStack_3b = t._inner._inner._content._4_4_;
  iVar2 = *(int *)&(this->super_IntermediateNode).field_0x14;
  if (0 < iVar2) {
    ppNVar4 = this->_nodes;
    lVar3 = 0;
    do {
      TVar5 = Kernel::TermList::top(&(*ppNVar4)->_term);
      iStack_4b = TVar5._inner._inner._content._4_4_;
      if ((t._inner._inner._0_1_ & 1) == (TVar5._inner._inner._0_1_ & 1)) {
        bVar1 = t._inner._inner._content[4] == TVar5._inner._inner._content[4];
        if (((undefined1  [12])t._inner._inner & (undefined1  [12])0x1) != (undefined1  [12])0x0) {
          bVar1 = iStack_3b == iStack_4b;
        }
        if ((t._inner._inner._content._0_4_ == TVar5._inner._inner._content._0_4_) && (bVar1)) {
          return ppNVar4;
        }
      }
      lVar3 = lVar3 + 1;
      iVar2 = *(int *)&(this->super_IntermediateNode).field_0x14;
      ppNVar4 = ppNVar4 + 1;
    } while (lVar3 < iVar2);
  }
  if (canCreate) {
    *(int *)&(this->super_IntermediateNode).field_0x14 = iVar2 + 1;
    ppNVar4 = this->_nodes + iVar2;
    this->_nodes[(long)iVar2 + 1] = (Node *)0x0;
  }
  else {
    ppNVar4 = (Node **)0x0;
  }
  return ppNVar4;
}

Assistant:

typename SubstitutionTree<LeafData_>::Node** SubstitutionTree<LeafData_>::UArrIntermediateNode::
	childByTop(TermList::Top t, bool canCreate)
{
  for(int i=0;i<_size;i++) {
    if(t == _nodes[i]->top()) {
      return &_nodes[i];
    }
  }
  if(canCreate) {
    ASS_L(_size,UARR_INTERMEDIATE_NODE_MAX_SIZE);
    ASS_EQ(_nodes[_size],0);
    _nodes[++_size]=0;
    return &_nodes[_size-1];
  }
  return 0;
}